

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test_boundary.cpp
# Opt level: O1

void test_word_container<wchar_t,__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
               (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                begin,__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                      end,vector<int,_std::allocator<int>_> *ipos,
               vector<int,_std::allocator<int>_> *imasks,
               vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *ichunks,locale *l,boundary_type bt)

{
  undefined8 uVar1;
  undefined4 uVar2;
  pointer pbVar3;
  pointer pbVar4;
  int iVar5;
  pointer piVar6;
  ostream *poVar7;
  ulong uVar8;
  runtime_error *prVar9;
  int *__args;
  ulong uVar10;
  ulong uVar11;
  uint uVar12;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  _Var13;
  bool bVar14;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  ptr;
  segment_index<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  map;
  ti_type ti_2;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  chunks;
  ti_type ti_4;
  vector<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>,_std::allocator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>_>
  iters;
  vector<int,_std::allocator<int>_> masks;
  vector<unsigned_int,_std::allocator<unsigned_int>_> bmasks;
  vector<int,_std::allocator<int>_> pos;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  fchunks;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> empty_chunk;
  undefined1 local_238 [16];
  mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_228;
  uint local_208;
  bool local_204;
  undefined1 local_1f8 [16];
  mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_1e8;
  uint local_1c8;
  bool local_1c4;
  undefined1 local_1b8 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  rule_type local_198;
  undefined1 local_194;
  uint local_18c;
  undefined1 local_188 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> _Stack_180;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_178;
  uint local_168;
  undefined1 local_164;
  base_iterator local_158;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  local_150;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_148;
  string local_128;
  uint local_108;
  undefined1 local_104;
  void *local_f8;
  iterator iStack_f0;
  __normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
  *local_e8;
  locale *local_e0;
  void *local_d8;
  iterator iStack_d0;
  int *local_c8;
  vector<int,_std::allocator<int>_> *local_c0;
  vector<unsigned_int,_std::allocator<unsigned_int>_> local_b8;
  void *local_98;
  iterator iStack_90;
  int *local_88;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  *local_80;
  vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
  local_78;
  vector<int,_std::allocator<int>_> *local_60;
  basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> local_58;
  ulong local_38;
  
  uVar11 = 3;
  local_158._M_current = end._M_current;
  local_150._M_current = begin._M_current;
  local_e0 = l;
  local_c0 = imasks;
  local_80 = ichunks;
  local_60 = ipos;
  if (bt == word) {
    uVar11 = 0x1f;
  }
  do {
    uVar12 = 0;
    if ((uVar11 & 1) != 0) {
      uVar12 = 0xf;
    }
    local_d8 = (void *)0x0;
    iStack_d0._M_current = (int *)0x0;
    local_c8 = (int *)0x0;
    local_88 = (int *)0x0;
    local_98 = (void *)0x0;
    iStack_90._M_current = (int *)0x0;
    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_end_of_storage = (uint *)0x0;
    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_start = (pointer)0x0;
    local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
    super__Vector_impl_data._M_finish = (uint *)0x0;
    local_58._M_dataplus._M_p = (pointer)&local_58.field_2;
    local_58._M_string_length = 0;
    local_58.field_2._M_local_buf[0] = L'\0';
    local_148.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_148.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
    local_78.
    super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
    local_f8 = (void *)0x0;
    iStack_f0._M_current =
         (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
          *)0x0;
    local_e8 = (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                *)0x0;
    std::
    vector<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,std::allocator<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>>
    ::_M_realloc_insert<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>const&>
              ((vector<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,std::allocator<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>>
                *)&local_f8,(iterator)0x0,&local_150);
    local_1f8._0_8_ = local_1f8._0_8_ & 0xffffffff00000000;
    if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_finish ==
        local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_end_of_storage) {
      std::vector<unsigned_int,_std::allocator<unsigned_int>_>::_M_realloc_insert<unsigned_int>
                (&local_b8,
                 (iterator)
                 local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish,(uint *)local_1f8);
    }
    else {
      *local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
       super__Vector_impl_data._M_finish = 0;
      local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
      super__Vector_impl_data._M_finish =
           local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
           super__Vector_impl_data._M_finish + 1;
    }
    iVar5 = (int)uVar11;
    local_18c = (iVar5 << 0x1b) >> 0x1f & 0xf0000U |
                (iVar5 << 0x1c) >> 0x1f & 0xf000U |
                (iVar5 << 0x1d) >> 0x1f & 0xf00U | (iVar5 << 0x1e) >> 0x1f & 0xf0U | uVar12;
    piVar6 = (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
             super__Vector_impl_data._M_start;
    local_38 = uVar11;
    if ((local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
        _M_finish != piVar6) {
      uVar11 = 1;
      uVar8 = 0;
      do {
        uVar10 = uVar11;
        if ((local_18c & piVar6[uVar8]) == 0) {
          std::__cxx11::wstring::_M_append
                    ((wchar_t *)&local_58,
                     (ulong)(local_80->
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            )._M_impl.super__Vector_impl_data._M_start[uVar8]._M_dataplus._M_p);
        }
        else {
          if (iStack_d0._M_current == local_c8) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_d8,iStack_d0,piVar6 + uVar8);
          }
          else {
            *iStack_d0._M_current = piVar6[uVar8];
            iStack_d0._M_current = iStack_d0._M_current + 1;
          }
          std::
          vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          ::push_back(&local_148,
                      (local_80->
                      super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                      )._M_impl.super__Vector_impl_data._M_start + uVar8);
          std::operator+((basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>
                          *)local_1f8,&local_58,
                         (local_80->
                         super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                         )._M_impl.super__Vector_impl_data._M_start + uVar8);
          std::vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>>::
          emplace_back<std::__cxx11::wstring>
                    ((vector<std::__cxx11::wstring,std::allocator<std::__cxx11::wstring>> *)
                     &local_78,
                     (basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_> *)
                     local_1f8);
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8._0_8_ != &local_1e8) {
            operator_delete((void *)local_1f8._0_8_);
          }
          local_58._M_string_length = 0;
          *local_58._M_dataplus._M_p = L'\0';
          __args = (local_60->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start + uVar8;
          if (iStack_90._M_current == local_88) {
            std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                      ((vector<int,std::allocator<int>> *)&local_98,iStack_90,__args);
          }
          else {
            *iStack_90._M_current = *__args;
            iStack_90._M_current = iStack_90._M_current + 1;
          }
        }
        piVar6 = (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        if (((piVar6[uVar8] & local_18c) != 0) ||
           (((long)(local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_finish - (long)piVar6 >> 2) - 1U == uVar8)) {
          local_1f8._0_8_ =
               local_150._M_current +
               (local_60->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
               super__Vector_impl_data._M_start[uVar8];
          if (iStack_f0._M_current == local_e8) {
            std::
            vector<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,std::allocator<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>>
            ::_M_realloc_insert<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>const&>
                      ((vector<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>,std::allocator<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>>
                        *)&local_f8,iStack_f0,
                       (__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>
                        *)local_1f8);
          }
          else {
            (iStack_f0._M_current)->_M_current = (wchar_t *)local_1f8._0_8_;
            iStack_f0._M_current = iStack_f0._M_current + 1;
          }
          uVar12 = (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                   super__Vector_impl_data._M_start[uVar8];
          local_238._0_4_ = uVar12;
          if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_finish ==
              local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
              super__Vector_impl_data._M_end_of_storage) {
            std::vector<unsigned_int,_std::allocator<unsigned_int>_>::
            _M_realloc_insert<unsigned_int>
                      (&local_b8,
                       (iterator)
                       local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish,(uint *)local_238);
          }
          else {
            *local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
             super__Vector_impl_data._M_finish = uVar12;
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish =
                 local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                 super__Vector_impl_data._M_finish + 1;
          }
        }
        piVar6 = (local_c0->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                 super__Vector_impl_data._M_start;
        uVar11 = (ulong)((int)uVar10 + 1);
        uVar8 = uVar10;
      } while (uVar10 < (ulong)((long)(local_c0->super__Vector_base<int,_std::allocator<int>_>).
                                      _M_impl.super__Vector_impl_data._M_finish - (long)piVar6 >> 2)
              );
    }
    booster::locale::boundary::details::
    mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::mapping((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1b8,bt,(base_iterator)local_150._M_current,local_158,local_e0);
    local_198 = local_18c;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (wchar_t *)0x0;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1e8.begin_._M_current = (wchar_t *)0x0;
    local_1e8.end_._M_current._0_5_ = 0;
    local_1e8.end_._M_current._5_3_ = 0;
    local_194 = 0;
    local_228.end_._M_current._0_5_ =
         SUB85((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)local_1b8,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_1b8 >> 0x28);
    local_208 = local_18c;
    local_204 = false;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_238._0_8_ = local_1a8._M_allocated_capacity;
    local_238._8_8_ = local_1a8._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    local_1f8._0_8_ = local_238._0_8_;
    local_1f8._8_8_ = local_238._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1e8.begin_._M_current = local_228.begin_._M_current;
    local_1c8 = local_208;
    local_1c4 = local_204;
    local_1e8.end_._M_current._0_5_ = local_228.end_._M_current._0_5_;
    local_1e8.end_._M_current._5_3_ = local_228.end_._M_current._5_3_;
    if (((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *)CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_) !=
         (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *)local_1b8) ||
       (uVar11 = 0,
       local_228.begin_._M_current !=
       (wchar_t *)
       ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b8 + 8))->_M_pi -
        *(long *)local_1b8 >> 4))) {
      uVar11 = 0;
      do {
        test_counter = test_counter + 1;
        local_238._0_8_ = &local_228;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_148.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar14 = true;
          }
          else {
            iVar5 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_148.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar14 = iVar5 == 0;
          }
        }
        else {
          bVar14 = false;
        }
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._0_8_ != &local_228) {
          operator_delete((void *)local_238._0_8_);
        }
        if (!bVar14) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x67);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->str()==chunks[i]",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar11 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x68);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," p->rule() == unsigned(masks[i])",0x20);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (((undefined1 *)
                CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
                local_1b8) ||
              (local_1e8.begin_._M_current !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b8 + 8))->_M_pi -
                *(long *)local_1b8 >> 4)));
    }
    test_counter = test_counter + 1;
    if ((long)local_148.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_148.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5 != uVar11) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x6b);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," chunks.size() == i",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar14 = 100000 < error_counter;
      error_counter = iVar5;
      if (bVar14) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_238._0_8_ = &local_228;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_238);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    while( true ) {
      uVar12 = (int)uVar11 - 1;
      uVar11 = (ulong)uVar12;
      local_228.end_._M_current._0_5_ = SUB85(local_1b8,0);
      local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_1b8 >> 0x28);
      local_208 = local_198;
      local_204 = (bool)local_194;
      local_228.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_228.begin_._M_current = (wchar_t *)0x0;
      local_238._0_8_ = local_1a8._M_allocated_capacity;
      local_238._8_8_ = local_1a8._M_allocated_capacity;
      local_228.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                ((ulong)local_228.index_.
                        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr & 0xffffffff00000000);
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)local_238);
      if ((CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) ==
           CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_)) &&
         (local_1e8.begin_._M_current == local_228.begin_._M_current)) break;
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::decrement((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)local_1f8);
      test_counter = test_counter + 1;
      local_238._0_8_ = &local_228;
      std::__cxx11::wstring::
      _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
      if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_238._8_8_ ==
          (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_148.
             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length) {
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)0x0) {
          bVar14 = true;
        }
        else {
          iVar5 = wmemcmp((wchar_t *)local_238._0_8_,
                          local_148.
                          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                          local_238._8_8_);
          bVar14 = iVar5 == 0;
        }
      }
      else {
        bVar14 = false;
      }
      if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_238._0_8_ != &local_228) {
        operator_delete((void *)local_238._0_8_);
      }
      if (!bVar14) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x73);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->str()==chunks[--i]",0x16);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        iVar5 = error_counter + 1;
        bVar14 = 100000 < error_counter;
        error_counter = iVar5;
        if (bVar14) goto LAB_00121f2a;
      }
      test_counter = test_counter + 1;
      if (local_1e8.index_.
          super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar11 * 4)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x74);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," p->rule() == unsigned(masks[i])",0x20);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        iVar5 = error_counter + 1;
        bVar14 = 100000 < error_counter;
        error_counter = iVar5;
        if (bVar14) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_238._0_8_ = &local_228;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar9,(string *)local_238);
          __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    test_counter = test_counter + 1;
    if (uVar12 != 0xffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x6e);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," i==0",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar14 = 100000 < error_counter;
      error_counter = iVar5;
      if (bVar14) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_238._0_8_ = &local_228;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_238);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    local_1e8.begin_._M_current =
         (wchar_t *)
         ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b8 + 8))->_M_pi -
          *(long *)local_1b8 >> 4);
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_1e8.begin_._M_current - 1);
    local_1f8._0_8_ = local_1a8._8_8_;
    local_1f8._8_8_ = local_1a8._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = L'\0';
    local_1e8.end_._M_current._0_5_ = SUB85(local_1b8,0);
    local_1e8.end_._M_current._5_3_ = (undefined3)((ulong)local_1b8 >> 0x28);
    local_1c8 = local_198;
    local_1c4 = (bool)local_194;
    if (local_148.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_148.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar11 = 0;
      uVar8 = 1;
      do {
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::decrement((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        pbVar4 = local_148.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar3 = local_148.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        test_counter = test_counter + 1;
        local_238._0_8_ = &local_228;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        uVar11 = (ulong)((int)((ulong)((long)pbVar4 - (long)pbVar3) >> 5) + ~(uint)uVar11);
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_148.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar14 = true;
          }
          else {
            iVar5 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_148.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar14 = iVar5 == 0;
          }
        }
        else {
          bVar14 = false;
        }
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._0_8_ != &local_228) {
          operator_delete((void *)local_238._0_8_);
        }
        if (!bVar14) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x7a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->str()==chunks[index]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar11 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x7b);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," p->rule() == unsigned(masks[index])",0x24);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        bVar14 = uVar8 < (ulong)((long)local_148.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_148.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar11 = uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar14);
    }
    test_counter = test_counter + 1;
    local_228.end_._M_current._0_5_ = SUB85(local_1b8,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_1b8 >> 0x28);
    local_208 = local_198;
    local_204 = (bool)local_194;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_238._0_8_ = local_1a8._M_allocated_capacity;
    local_238._8_8_ = local_1a8._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    if ((CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
         CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_)) ||
       (local_1e8.begin_._M_current != local_228.begin_._M_current)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x7d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," p==map.begin()",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar14 = 100000 < error_counter;
      error_counter = iVar5;
      if (bVar14) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_238._0_8_ = &local_228;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_238);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (wchar_t *)0x0;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1e8.begin_._M_current = (wchar_t *)0x0;
    local_1e8.end_._M_current._0_5_ = 0;
    local_1e8.end_._M_current._5_3_ = 0;
    local_194 = 1;
    local_228.end_._M_current._0_5_ = SUB85(local_1b8,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_1b8 >> 0x28);
    local_208 = local_198;
    local_204 = true;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_238._0_8_ = local_1a8._M_allocated_capacity;
    local_238._8_8_ = local_1a8._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    local_1f8._0_8_ = local_238._0_8_;
    local_1f8._8_8_ = local_238._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1e8.begin_._M_current = local_228.begin_._M_current;
    local_1c8 = local_208;
    local_1c4 = local_204;
    local_1e8.end_._M_current._0_5_ = local_228.end_._M_current._0_5_;
    local_1e8.end_._M_current._5_3_ = local_228.end_._M_current._5_3_;
    if (((undefined1 *)CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_) !=
         local_1b8) ||
       (uVar11 = 0,
       local_228.begin_._M_current !=
       (wchar_t *)
       ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b8 + 8))->_M_pi -
        *(long *)local_1b8 >> 4))) {
      uVar11 = 0;
      do {
        test_counter = test_counter + 1;
        local_238._0_8_ = &local_228;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_78.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar14 = true;
          }
          else {
            iVar5 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_78.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar14 = iVar5 == 0;
          }
        }
        else {
          bVar14 = false;
        }
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._0_8_ != &local_228) {
          operator_delete((void *)local_238._0_8_);
        }
        if (!bVar14) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x85);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->str()==fchunks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar11 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x86);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," p->rule() == unsigned(masks[i])",0x20);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (((undefined1 *)
                CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
                local_1b8) ||
              (local_1e8.begin_._M_current !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b8 + 8))->_M_pi -
                *(long *)local_1b8 >> 4)));
    }
    test_counter = test_counter + 1;
    if ((long)local_148.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)local_148.
              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 5 != uVar11) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x89);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," chunks.size() == i",0x13);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar14 = 100000 < error_counter;
      error_counter = iVar5;
      if (bVar14) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_238._0_8_ = &local_228;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_238);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    while( true ) {
      uVar12 = (int)uVar11 - 1;
      uVar11 = (ulong)uVar12;
      local_228.end_._M_current._0_5_ = SUB85(local_1b8,0);
      local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_1b8 >> 0x28);
      local_208 = local_198;
      local_204 = (bool)local_194;
      local_228.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
      local_228.begin_._M_current = (wchar_t *)0x0;
      local_238._0_8_ = local_1a8._M_allocated_capacity;
      local_238._8_8_ = local_1a8._M_allocated_capacity;
      local_228.index_.
      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
      ._M_ptr = (element_type *)
                ((ulong)local_228.index_.
                        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                        ._M_ptr & 0xffffffff00000000);
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)local_238);
      if ((CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) ==
           CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_)) &&
         (local_1e8.begin_._M_current == local_228.begin_._M_current)) break;
      booster::locale::boundary::details::
      segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::decrement((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)local_1f8);
      local_238._0_8_ = &local_228;
      std::__cxx11::wstring::
      _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
      bVar14 = true;
      if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_238._8_8_ ==
          (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_78.
             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length) {
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)0x0) {
          bVar14 = false;
        }
        else {
          iVar5 = wmemcmp((wchar_t *)local_238._0_8_,
                          local_78.
                          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                          local_238._8_8_);
          bVar14 = iVar5 != 0;
        }
      }
      if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_238._0_8_ != &local_228) {
        operator_delete((void *)local_238._0_8_);
      }
      if (bVar14) {
        local_238._0_8_ = &local_228;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._0_8_ != &local_228) {
          operator_delete((void *)local_238._0_8_);
        }
      }
      test_counter = test_counter + 1;
      local_238._0_8_ = &local_228;
      std::__cxx11::wstring::
      _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
      if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_238._8_8_ ==
          (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_78.
             super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length) {
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)0x0) {
          bVar14 = true;
        }
        else {
          iVar5 = wmemcmp((wchar_t *)local_238._0_8_,
                          local_78.
                          super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                          ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                          local_238._8_8_);
          bVar14 = iVar5 == 0;
        }
      }
      else {
        bVar14 = false;
      }
      if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_238._0_8_ != &local_228) {
        operator_delete((void *)local_238._0_8_);
      }
      if (!bVar14) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x96);
        std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->str()==fchunks[--i]",0x17);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        iVar5 = error_counter + 1;
        bVar14 = 100000 < error_counter;
        error_counter = iVar5;
        if (bVar14) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_238._0_8_ = &local_228;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar9,(string *)local_238);
          __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
      test_counter = test_counter + 1;
      if (local_1e8.index_.
          super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
          ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar11 * 4)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x97);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," p->rule() == unsigned(masks[i])",0x20);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        iVar5 = error_counter + 1;
        bVar14 = 100000 < error_counter;
        error_counter = iVar5;
        if (bVar14) {
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_238._0_8_ = &local_228;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar9,(string *)local_238);
          __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
      }
    }
    test_counter = test_counter + 1;
    if (uVar12 != 0xffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x8d);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," i==0",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar14 = 100000 < error_counter;
      error_counter = iVar5;
      if (bVar14) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_238._0_8_ = &local_228;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_238);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    local_1e8.begin_._M_current =
         (wchar_t *)
         ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b8 + 8))->_M_pi -
          *(long *)local_1b8 >> 4);
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)((long)local_1e8.begin_._M_current - 1);
    local_1f8._0_8_ = local_1a8._8_8_;
    local_1f8._8_8_ = local_1a8._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ = L'\0';
    local_1e8.end_._M_current._0_5_ = SUB85(local_1b8,0);
    local_1e8.end_._M_current._5_3_ = (undefined3)((ulong)local_1b8 >> 0x28);
    local_1c8 = local_198;
    local_1c4 = (bool)local_194;
    if (local_148.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_finish !=
        local_148.
        super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ._M_impl.super__Vector_impl_data._M_start) {
      uVar11 = 0;
      uVar8 = 1;
      do {
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::decrement((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        pbVar4 = local_148.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish;
        pbVar3 = local_148.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start;
        test_counter = test_counter + 1;
        local_238._0_8_ = &local_228;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        uVar11 = (ulong)((int)((ulong)((long)pbVar4 - (long)pbVar3) >> 5) + ~(uint)uVar11);
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_78.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar14 = true;
          }
          else {
            iVar5 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_78.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar14 = iVar5 == 0;
          }
        }
        else {
          bVar14 = false;
        }
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._0_8_ != &local_228) {
          operator_delete((void *)local_238._0_8_);
        }
        if (!bVar14) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x9e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," p->str()==fchunks[index]",0x19);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar11 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x9f);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," p->rule() == unsigned(masks[index])",0x24);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        bVar14 = uVar8 < (ulong)((long)local_148.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_finish -
                                 (long)local_148.
                                       super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                                       ._M_impl.super__Vector_impl_data._M_start >> 5);
        uVar11 = uVar8;
        uVar8 = (ulong)((int)uVar8 + 1);
      } while (bVar14);
    }
    test_counter = test_counter + 1;
    local_228.end_._M_current._0_5_ = SUB85(local_1b8,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_1b8 >> 0x28);
    local_208 = local_198;
    local_204 = (bool)local_194;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_238._0_8_ = local_1a8._M_allocated_capacity;
    local_238._8_8_ = local_1a8._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    if ((CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
         CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_)) ||
       (local_1e8.begin_._M_current != local_228.begin_._M_current)) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xa1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," p==map.begin()",0xf);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar14 = 100000 < error_counter;
      error_counter = iVar5;
      if (bVar14) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_238._0_8_ = &local_228;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_238,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_238);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    local_194 = 0;
    if (local_150._M_current != local_158._M_current) {
      uVar12 = 0;
      uVar11 = 0;
      _Var13._M_current = local_150._M_current;
      do {
        local_1f8._0_8_ =
             (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)0x0;
        local_1f8._8_8_ =
             (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)0x0;
        local_1e8.index_.
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1e8.begin_._M_current = (wchar_t *)0x0;
        local_1e8.end_._M_current._0_5_ = SUB85(local_1b8,0);
        local_1e8.end_._M_current._5_3_ = (undefined3)((ulong)local_1b8 >> 0x28);
        local_1c8 = local_198;
        local_1c4 = (bool)local_194;
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::set((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8,(base_iterator)_Var13._M_current);
        uVar2 = local_1e8.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr._0_4_;
        uVar1 = local_1f8._0_8_;
        uVar8 = (long)iStack_90._M_current - (long)local_98 >> 2;
        if (uVar11 < uVar8) {
          uVar11 = (ulong)(((int)uVar11 + 1) -
                          (uint)(uVar12 < *(uint *)((long)local_98 + uVar11 * 4)));
        }
        test_counter = test_counter + 1;
        if (uVar11 < uVar8) {
          local_1f8._0_8_ = &local_1e8;
          std::__cxx11::wstring::
          _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                    ((wstring *)local_1f8,uVar1,local_1f8._8_8_);
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_148.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length) {
            if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_1f8._8_8_ ==
                (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)0x0) {
              bVar14 = true;
            }
            else {
              iVar5 = wmemcmp((wchar_t *)local_1f8._0_8_,
                              local_148.
                              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                              local_1f8._8_8_);
              bVar14 = iVar5 == 0;
            }
          }
          else {
            bVar14 = false;
          }
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8._0_8_ != &local_1e8) {
            operator_delete((void *)local_1f8._0_8_);
          }
          if (!bVar14) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error in line:",0xe);
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb2);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7," p->str()==chunks[chunk_ptr]",0x1c);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            iVar5 = error_counter + 1;
            bVar14 = 100000 < error_counter;
            error_counter = iVar5;
            if (bVar14) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
              local_1f8._0_8_ = &local_1e8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1f8,"Error limits reached, stopping unit test","");
              booster::runtime_error::runtime_error(prVar9,(string *)local_1f8);
              __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                          booster::runtime_error::~runtime_error);
            }
          }
          test_counter = test_counter + 1;
          if (uVar2 != *(wchar_t *)((long)local_d8 + uVar11 * 4)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error in line:",0xe);
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xb3);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7," p->rule()==unsigned(masks[chunk_ptr])",0x26);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            iVar5 = error_counter + 1;
            bVar14 = 100000 < error_counter;
            error_counter = iVar5;
            if (bVar14) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
              local_1f8._0_8_ = &local_1e8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1f8,"Error limits reached, stopping unit test","");
              booster::runtime_error::runtime_error(prVar9,(string *)local_1f8);
              __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                          booster::runtime_error::~runtime_error);
            }
          }
        }
        else if (((undefined1 *)
                  CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
                  local_1b8) ||
                (local_1e8.begin_._M_current !=
                 (wchar_t *)
                 ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b8 + 8))->_M_pi
                  - *(long *)local_1b8 >> 4))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xaf);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p==map.end()",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_1f8._0_8_ = &local_1e8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1f8,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_1f8);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        _Var13._M_current = _Var13._M_current + 1;
        uVar12 = uVar12 + 1;
      } while (_Var13._M_current != local_158._M_current);
    }
    local_194 = 1;
    if (local_150._M_current != local_158._M_current) {
      uVar12 = 0;
      uVar11 = 0;
      _Var13._M_current = local_150._M_current;
      do {
        local_1f8._0_8_ =
             (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)0x0;
        local_1f8._8_8_ =
             (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)0x0;
        local_1e8.index_.
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
        local_1e8.begin_._M_current = (wchar_t *)0x0;
        local_1e8.end_._M_current._0_5_ = SUB85(local_1b8,0);
        local_1e8.end_._M_current._5_3_ = (undefined3)((ulong)local_1b8 >> 0x28);
        local_1c8 = local_198;
        local_1c4 = (bool)local_194;
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::set((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8,(base_iterator)_Var13._M_current);
        uVar2 = local_1e8.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr._0_4_;
        uVar1 = local_1f8._0_8_;
        uVar8 = (long)iStack_90._M_current - (long)local_98 >> 2;
        if (uVar11 < uVar8) {
          uVar11 = (ulong)(((int)uVar11 + 1) -
                          (uint)(uVar12 < *(uint *)((long)local_98 + uVar11 * 4)));
        }
        test_counter = test_counter + 1;
        if (uVar11 < uVar8) {
          local_1f8._0_8_ = &local_1e8;
          std::__cxx11::wstring::
          _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                    ((wstring *)local_1f8,uVar1,local_1f8._8_8_);
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_78.
                 super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length) {
            if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_1f8._8_8_ ==
                (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)0x0) {
              bVar14 = true;
            }
            else {
              iVar5 = wmemcmp((wchar_t *)local_1f8._0_8_,
                              local_78.
                              super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                              ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                              local_1f8._8_8_);
              bVar14 = iVar5 == 0;
            }
          }
          else {
            bVar14 = false;
          }
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8._0_8_ != &local_1e8) {
            operator_delete((void *)local_1f8._0_8_);
          }
          if (!bVar14) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error in line:",0xe);
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc5);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7," p->str()==fchunks[chunk_ptr]",0x1d);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            iVar5 = error_counter + 1;
            bVar14 = 100000 < error_counter;
            error_counter = iVar5;
            if (bVar14) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
              local_1f8._0_8_ = &local_1e8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1f8,"Error limits reached, stopping unit test","");
              booster::runtime_error::runtime_error(prVar9,(string *)local_1f8);
              __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                          booster::runtime_error::~runtime_error);
            }
          }
          test_counter = test_counter + 1;
          if (uVar2 != *(wchar_t *)((long)local_d8 + uVar11 * 4)) {
            std::__ostream_insert<char,std::char_traits<char>>
                      ((ostream *)&std::cerr,"Error in line:",0xe);
            poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc6);
            std::__ostream_insert<char,std::char_traits<char>>
                      (poVar7," p->rule()==unsigned(masks[chunk_ptr])",0x26);
            std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
            std::ostream::put((char)poVar7);
            std::ostream::flush();
            iVar5 = error_counter + 1;
            bVar14 = 100000 < error_counter;
            error_counter = iVar5;
            if (bVar14) {
              prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
              local_1f8._0_8_ = &local_1e8;
              std::__cxx11::string::_M_construct<char_const*>
                        ((string *)local_1f8,"Error limits reached, stopping unit test","");
              booster::runtime_error::runtime_error(prVar9,(string *)local_1f8);
              __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                          booster::runtime_error::~runtime_error);
            }
          }
        }
        else if (((undefined1 *)
                  CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
                  local_1b8) ||
                (local_1e8.begin_._M_current !=
                 (wchar_t *)
                 ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b8 + 8))->_M_pi
                  - *(long *)local_1b8 >> 4))) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xc2);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p==map.end()",0xd);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_1f8._0_8_ = &local_1e8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1f8,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_1f8);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        _Var13._M_current = _Var13._M_current + 1;
        uVar12 = uVar12 + 1;
      } while (_Var13._M_current != local_158._M_current);
    }
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)_Stack_1b0._M_pi !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1b0._M_pi);
    }
    booster::locale::boundary::details::
    mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::mapping((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8,bt,(base_iterator)local_150._M_current,local_158,local_e0);
    local_1e8.begin_._M_current._0_4_ = local_18c;
    uVar11 = 0;
    local_238._0_8_ =
         CONCAT44(local_1e8.index_.
                  super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr._4_4_,
                  local_1e8.index_.
                  super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr._0_4_);
    local_238._8_8_ = local_238._8_8_ & 0xffffffff00000000;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_228.begin_._M_current._0_4_ = local_18c;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8;
    if ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._0_8_ + 8))->_M_pi -
        *(long *)local_1f8._0_8_ >> 4 != 0) {
      uVar11 = 0;
      do {
        test_counter = test_counter + 1;
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._0_8_ !=
            *(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              **)((long)local_f8 + uVar11 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd6);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->iterator()==iters[i]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_1b8 = (undefined1  [8])&local_1a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_1b8);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_238._8_4_ !=
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xd7);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->rule()==bmasks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_1b8 = (undefined1  [8])&local_1a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_1b8);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_238);
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_228.index_.
                   super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                   ._M_refcount._M_pi !=
                (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_1f8) ||
              ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)local_228.index_.
                  super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr !=
               (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._0_8_ + 8))->
                         _M_pi - *(long *)local_1f8._0_8_ >> 4)));
    }
    test_counter = test_counter + 1;
    if ((long)iStack_f0._M_current - (long)local_f8 >> 3 != uVar11) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xda);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," iters.size() == i",0x12);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar14 = 100000 < error_counter;
      error_counter = iVar5;
      if (bVar14) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_1b8 = (undefined1  [8])&local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_1b8);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    uVar12 = (int)uVar11 - 1;
    do {
      booster::locale::boundary::details::
      boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
      ::decrement((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                   *)local_238);
      test_counter = test_counter + 1;
      if ((ulong)((long)iStack_f0._M_current - (long)local_f8 >> 3) <= (ulong)uVar12) {
        std::__throw_out_of_range_fmt
                  ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)");
LAB_00121eb6:
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_1b8 = (undefined1  [8])&local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_1b8);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
      if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
           *)local_238._0_8_ !=
          *(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
            **)((long)local_f8 + (ulong)uVar12 * 8)) {
        std::__ostream_insert<char,std::char_traits<char>>
                  ((ostream *)&std::cerr,"Error in line:",0xe);
        poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xdf);
        std::__ostream_insert<char,std::char_traits<char>>
                  (poVar7," p->iterator()==iters.at(i)",0x1b);
        std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
        std::ostream::put((char)poVar7);
        std::ostream::flush();
        iVar5 = error_counter + 1;
        bVar14 = 100000 < error_counter;
        error_counter = iVar5;
        if (bVar14) goto LAB_00121eb6;
      }
      uVar12 = uVar12 - 1;
    } while (((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_228.index_.
                 super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                 ._M_refcount._M_pi !=
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8) ||
            ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)local_228.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr !=
             (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              *)0x0));
    test_counter = test_counter + 1;
    if (uVar12 != 0xffffffff) {
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)&std::cerr,"Error in line:",0xe)
      ;
      poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe1);
      std::__ostream_insert<char,std::char_traits<char>>(poVar7," i==0",5);
      std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
      std::ostream::put((char)poVar7);
      std::ostream::flush();
      iVar5 = error_counter + 1;
      bVar14 = 100000 < error_counter;
      error_counter = iVar5;
      if (bVar14) {
        prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
        local_1b8 = (undefined1  [8])&local_1a8;
        std::__cxx11::string::_M_construct<char_const*>
                  ((string *)local_1b8,"Error limits reached, stopping unit test","");
        booster::runtime_error::runtime_error(prVar9,(string *)local_1b8);
        __cxa_throw(prVar9,&booster::runtime_error::typeinfo,booster::runtime_error::~runtime_error)
        ;
      }
    }
    if (local_150._M_current != local_158._M_current) {
      uVar11 = 0;
      _Var13._M_current = local_150._M_current;
      do {
        local_1b8 = (undefined1  [8])0x0;
        _Stack_1b0._M_pi = _Stack_1b0._M_pi & 0xffffffff00000000;
        local_1a8._8_8_ = local_1f8;
        local_198 = (uint)local_1e8.begin_._M_current;
        booster::locale::boundary::details::
        boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::set((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1b8,(base_iterator)_Var13._M_current);
        local_228.begin_._M_current._0_4_ = local_198;
        local_228.index_.
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_ptr = (element_type *)local_1a8._M_allocated_capacity;
        local_228.index_.
        super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
        ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1a8._8_8_;
        local_238._0_8_ = local_1b8;
        local_238._8_8_ = _Stack_1b0._M_pi;
        test_counter = test_counter + 1;
        if (local_1b8 !=
            (undefined1  [8])
            *(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              **)((long)local_f8 + uVar11 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xe6);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," p->iterator()==iters[iters_ptr]",0x20);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_1b8 = (undefined1  [8])&local_1a8;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_1b8,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_1b8);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        if ((ulong)((long)iStack_f0._M_current - (long)local_f8 >> 3) <= uVar11) {
          std::__throw_out_of_range_fmt
                    ("vector::_M_range_check: __n (which is %zu) >= this->size() (which is %zu)",
                     uVar11);
LAB_00121f2a:
          prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
          local_238._0_8_ = &local_228;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)local_238,"Error limits reached, stopping unit test","");
          booster::runtime_error::runtime_error(prVar9,(string *)local_238);
          __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                      booster::runtime_error::~runtime_error);
        }
        uVar11 = (ulong)((int)uVar11 +
                        (uint)(_Var13._M_current == *(wchar_t **)((long)local_f8 + uVar11 * 8)));
        _Var13._M_current = _Var13._M_current + 1;
      } while (_Var13._M_current != local_158._M_current);
    }
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)local_1f8._8_8_ !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
    }
    booster::locale::boundary::details::
    mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::mapping((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1f8,bt,(base_iterator)local_150._M_current,local_158,local_e0);
    local_1e8.begin_._M_current =
         (wchar_t *)
         (CONCAT44((int)((ulong)local_1e8.begin_._M_current >> 0x20),local_18c) & 0xffffff00ffffffff
         );
    local_238._0_8_ = local_1f8._0_8_;
    local_238._8_8_ = local_1f8._8_8_;
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)local_1f8._8_8_ !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._8_8_ + 8))->_M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._8_8_ + 8))->_M_pi +
             1;
        UNLOCK();
      }
      else {
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._8_8_ + 8))->_M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._8_8_ + 8))->_M_pi +
             1;
      }
    }
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              CONCAT44(local_1e8.index_.
                       super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._4_4_,
                       local_1e8.index_.
                       super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._0_4_);
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_1e8.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_228.begin_._M_current._0_4_ = local_18c;
    _Stack_1b0._M_pi = _Stack_1b0._M_pi & 0xffffffff00000000;
    local_1a8._M_allocated_capacity = 0;
    local_198 = local_18c;
    local_1b8 = (undefined1  [8])
                local_228.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    local_1a8._8_8_ = local_238;
    if ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8._0_8_ + 8))->_M_pi -
        *(long *)local_1f8._0_8_ >> 4 != 0) {
      uVar11 = 0;
      local_1a8._8_8_ = local_238;
      do {
        test_counter = test_counter + 1;
        if (local_1b8 != (undefined1  [8])*(element_type **)((long)local_f8 + uVar11 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xf9);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->iterator()==iters[i]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_188 = (undefined1  [8])&local_178;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_188,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_188);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if ((uint)_Stack_1b0._M_pi !=
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0xfa);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->rule()==bmasks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_188 = (undefined1  [8])&local_178;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_188,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_188);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1b8);
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (((undefined1 *)local_1a8._8_8_ != local_238) ||
              ((wchar_t *)local_1a8._M_allocated_capacity !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238._0_8_ + 8))->_M_pi -
                *(long *)local_238._0_8_ >> 4)));
    }
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)local_238._8_8_ !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
    }
    local_238._8_8_ = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)0x0;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current._0_4_ = local_18c;
    local_238._0_8_ = local_1f8._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238 + 8),
               (__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_1f8 + 8));
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              CONCAT44(local_1e8.index_.
                       super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._4_4_,
                       local_1e8.index_.
                       super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr._0_4_);
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_1e8.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    _Stack_1b0._M_pi = _Stack_1b0._M_pi & 0xffffffff00000000;
    local_1a8._M_allocated_capacity = 0;
    local_198 = (uint)local_228.begin_._M_current;
    local_1b8 = (undefined1  [8])
                local_228.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    local_1a8._8_8_ = local_238;
    if ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238._0_8_ + 8))->_M_pi -
        *(long *)local_238._0_8_ >> 4 != 0) {
      uVar11 = 0;
      local_1a8._8_8_ = local_238;
      do {
        test_counter = test_counter + 1;
        if (local_1b8 !=
            (undefined1  [8])
            *(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              **)((long)local_f8 + uVar11 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x104);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->iterator()==iters[i]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_188 = (undefined1  [8])&local_178;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_188,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_188);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if ((uint)_Stack_1b0._M_pi !=
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x105);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->rule()==bmasks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_188 = (undefined1  [8])&local_178;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_188,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_188);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1b8);
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (((undefined1 *)local_1a8._8_8_ != local_238) ||
              ((wchar_t *)local_1a8._M_allocated_capacity !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238._0_8_ + 8))->_M_pi -
                *(long *)local_238._0_8_ >> 4)));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
    }
    booster::locale::boundary::details::
    mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::mapping((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238,bt,(base_iterator)local_150._M_current,local_158,local_e0);
    local_228.begin_._M_current._0_4_ = local_18c;
    local_1b8 = (undefined1  [8])local_238._0_8_;
    _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_;
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(_Atomic_word *)(local_238._8_8_ + 8) = *(_Atomic_word *)(local_238._8_8_ + 8) + 1;
        UNLOCK();
      }
      else {
        *(_Atomic_word *)(local_238._8_8_ + 8) = *(_Atomic_word *)(local_238._8_8_ + 8) + 1;
      }
    }
    local_1a8._M_allocated_capacity =
         (size_type)
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_1a8._8_8_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_198 = local_18c;
    local_188 = (undefined1  [8])
                local_228.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    _Stack_180._M_pi = _Stack_180._M_pi & 0xffffffff00000000;
    local_178._M_allocated_capacity = 0;
    local_178._8_8_ = local_1b8;
    local_168 = local_18c;
    if ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238._0_8_ + 8))->_M_pi -
        *(long *)local_238._0_8_ >> 4 != 0) {
      uVar11 = 0;
      do {
        test_counter = test_counter + 1;
        if (local_188 !=
            (undefined1  [8])
            *(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              **)((long)local_f8 + uVar11 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x110);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->iterator()==iters[i]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,&local_128);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if ((uint)_Stack_180._M_pi !=
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar11]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x111);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->rule()==bmasks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,&local_128);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_188);
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (((mapping_type *)local_178._8_8_ != (mapping_type *)local_1b8) ||
              ((wchar_t *)local_178._M_allocated_capacity !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b8 + 8))->_M_pi -
                *(long *)local_1b8 >> 4)));
    }
    if (_Stack_1b0._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1b0._M_pi);
    }
    _Stack_1b0._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1a8._M_allocated_capacity = 0;
    local_1a8._8_8_ = (wchar_t *)0x0;
    local_198 = 0xffffffff;
    local_1b8 = (undefined1  [8])local_238._0_8_;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              (&_Stack_1b0,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_238 + 8));
    local_1a8._M_allocated_capacity =
         (size_type)
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr;
    local_1a8._8_8_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_198 = (uint)local_228.begin_._M_current;
    local_188 = (undefined1  [8])
                local_228.index_.
                super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                ._M_ptr;
    _Stack_180._M_pi = _Stack_180._M_pi & 0xffffffff00000000;
    local_178._M_allocated_capacity = 0;
    local_178._8_8_ = local_1b8;
    local_168 = (uint)local_228.begin_._M_current;
    if ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b8 + 8))->_M_pi -
        *(long *)local_1b8 >> 4 != 0) {
      uVar12 = 0;
      do {
        test_counter = test_counter + 1;
        if (local_188 !=
            (undefined1  [8])
            *(mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
              **)((long)local_f8 + (ulong)uVar12 * 8)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x11a);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->iterator()==iters[i]",0x18)
          ;
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,&local_128);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if ((uint)_Stack_180._M_pi !=
            local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start[uVar12]) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x11b);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->rule()==bmasks[i]",0x15);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_128._M_dataplus._M_p = (pointer)&local_128.field_2;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)&local_128,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,&local_128);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_188);
        uVar12 = uVar12 + 1;
      } while (((mapping_type *)local_178._8_8_ != (mapping_type *)local_1b8) ||
              ((wchar_t *)local_178._M_allocated_capacity !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_1b8 + 8))->_M_pi -
                *(long *)local_1b8 >> 4)));
    }
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)_Stack_1b0._M_pi !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1b0._M_pi);
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_ !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_238._8_8_);
    }
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)local_1f8._8_8_ !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_1f8._8_8_);
    }
    booster::locale::boundary::details::
    mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::mapping((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_1b8,bt,(base_iterator)local_150._M_current,local_158,local_e0);
    local_198 = 0xffffffff;
    local_188 = local_1b8;
    _Stack_180._M_pi = _Stack_1b0._M_pi;
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)_Stack_1b0._M_pi !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(_Stack_1b0._M_pi)->_M_use_count)->
                 _M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      &(_Stack_1b0._M_pi)->_M_use_count)->_M_pi + 1;
        UNLOCK();
      }
      else {
        *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&(_Stack_1b0._M_pi)->_M_use_count)->
                 _M_pi =
             *(int *)&((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      &(_Stack_1b0._M_pi)->_M_use_count)->_M_pi + 1;
      }
    }
    local_178._M_allocated_capacity = local_1a8._M_allocated_capacity;
    local_178._8_8_ = local_1a8._8_8_;
    local_164 = 0;
    local_168 = local_18c;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (wchar_t *)0x0;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1e8.begin_._M_current = (wchar_t *)0x0;
    local_1e8.end_._M_current._0_5_ = 0;
    local_1e8.end_._M_current._5_3_ = 0;
    local_228.end_._M_current._0_5_ =
         SUB85((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                *)local_188,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_188 >> 0x28);
    local_208 = local_18c;
    local_204 = false;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_238._0_8_ = local_1a8._M_allocated_capacity;
    local_238._8_8_ = local_1a8._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    local_1f8._0_8_ = local_238._0_8_;
    local_1f8._8_8_ = local_238._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1e8.begin_._M_current = local_228.begin_._M_current;
    local_1c8 = local_208;
    local_1c4 = local_204;
    local_1e8.end_._M_current._0_5_ = local_228.end_._M_current._0_5_;
    local_1e8.end_._M_current._5_3_ = local_228.end_._M_current._5_3_;
    if (((boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *)CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_) !=
         (boundary_point_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
          *)local_188) ||
       (local_228.begin_._M_current !=
        (wchar_t *)
        ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_188 + 8))->_M_pi -
         *(long *)local_188 >> 4))) {
      uVar11 = 0;
      do {
        test_counter = test_counter + 1;
        local_238._0_8_ = &local_228;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_148.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar14 = true;
          }
          else {
            iVar5 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_148.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar14 = iVar5 == 0;
          }
        }
        else {
          bVar14 = false;
        }
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._0_8_ != &local_228) {
          operator_delete((void *)local_238._0_8_);
        }
        if (!bVar14) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x127);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->str()==chunks[i]",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar11 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x128);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," p->rule()==unsigned(masks[i])",0x1e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (((undefined1 *)
                CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
                local_188) ||
              (local_1e8.begin_._M_current !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_188 + 8))->_M_pi -
                *(long *)local_188 >> 4)));
    }
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)_Stack_180._M_pi !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_180._M_pi);
    }
    _Stack_180._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_178._M_allocated_capacity = 0;
    local_178._8_8_ = (mapping_type *)0x0;
    local_164 = 0;
    local_168 = local_18c;
    local_188 = local_1b8;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=(&_Stack_180,&_Stack_1b0);
    local_178._M_allocated_capacity = local_1a8._M_allocated_capacity;
    local_178._8_8_ = local_1a8._8_8_;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (wchar_t *)0x0;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1e8.begin_._M_current = (wchar_t *)0x0;
    local_1e8.end_._M_current._0_5_ = 0;
    local_1e8.end_._M_current._5_3_ = 0;
    local_228.end_._M_current._0_5_ = SUB85(local_188,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)local_188 >> 0x28);
    local_208 = local_168;
    local_204 = (bool)local_164;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_238._0_8_ = local_1a8._M_allocated_capacity;
    local_238._8_8_ = local_1a8._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    local_1f8._0_8_ = local_238._0_8_;
    local_1f8._8_8_ = local_238._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1e8.begin_._M_current = local_228.begin_._M_current;
    local_1c8 = local_208;
    local_1c4 = local_204;
    local_1e8.end_._M_current._0_5_ = local_228.end_._M_current._0_5_;
    local_1e8.end_._M_current._5_3_ = local_228.end_._M_current._5_3_;
    if (((undefined1 *)CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_) !=
         local_188) ||
       (local_228.begin_._M_current !=
        (wchar_t *)
        ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_188 + 8))->_M_pi -
         *(long *)local_188 >> 4))) {
      uVar11 = 0;
      do {
        test_counter = test_counter + 1;
        local_238._0_8_ = &local_228;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_148.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar14 = true;
          }
          else {
            iVar5 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_148.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar14 = iVar5 == 0;
          }
        }
        else {
          bVar14 = false;
        }
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._0_8_ != &local_228) {
          operator_delete((void *)local_238._0_8_);
        }
        if (!bVar14) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x132);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->str()==chunks[i]",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar11 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x133);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," p->rule()==unsigned(masks[i])",0x1e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (((undefined1 *)
                CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_) !=
                local_188) ||
              (local_1e8.begin_._M_current !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)((long)local_188 + 8))->_M_pi -
                *(long *)local_188 >> 4)));
    }
    if (_Stack_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_180._M_pi);
    }
    booster::locale::boundary::details::
    mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::mapping((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_188,bt,(base_iterator)local_150._M_current,local_158,local_e0);
    local_164 = 0;
    local_168 = local_18c;
    local_128._M_dataplus._M_p = (pointer)local_188;
    local_128._M_string_length = (size_type)_Stack_180._M_pi;
    if (_Stack_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      if (__libc_single_threaded == '\0') {
        LOCK();
        (_Stack_180._M_pi)->_M_use_count = (_Stack_180._M_pi)->_M_use_count + 1;
        UNLOCK();
      }
      else {
        (_Stack_180._M_pi)->_M_use_count = (_Stack_180._M_pi)->_M_use_count + 1;
      }
    }
    local_128.field_2._M_allocated_capacity = local_178._M_allocated_capacity;
    local_128.field_2._8_8_ = local_178._8_8_;
    local_104 = 0;
    local_108 = local_18c;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (wchar_t *)0x0;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1e8.begin_._M_current = (wchar_t *)0x0;
    local_1e8.end_._M_current._0_5_ = 0;
    local_1e8.end_._M_current._5_3_ = 0;
    local_228.end_._M_current._0_5_ = SUB85(&local_128,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)&local_128 >> 0x28);
    local_208 = local_18c;
    local_204 = false;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_238._0_8_ = local_178._M_allocated_capacity;
    local_238._8_8_ = local_178._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    local_1f8._0_8_ = local_238._0_8_;
    local_1f8._8_8_ = local_238._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1e8.begin_._M_current = local_228.begin_._M_current;
    local_1c8 = local_208;
    local_1c4 = local_204;
    local_1e8.end_._M_current._0_5_ = local_228.end_._M_current._0_5_;
    local_1e8.end_._M_current._5_3_ = local_228.end_._M_current._5_3_;
    if (((string *)CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_) !=
         &local_128) ||
       (local_228.begin_._M_current !=
        (wchar_t *)
        ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128._M_dataplus._M_p + 8))->
               _M_pi - *(long *)local_128._M_dataplus._M_p >> 4))) {
      uVar11 = 0;
      do {
        test_counter = test_counter + 1;
        local_238._0_8_ = &local_228;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_148.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar14 = true;
          }
          else {
            iVar5 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_148.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar14 = iVar5 == 0;
          }
        }
        else {
          bVar14 = false;
        }
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._0_8_ != &local_228) {
          operator_delete((void *)local_238._0_8_);
        }
        if (!bVar14) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x13d);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->str()==chunks[i]",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar11 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x13e);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," p->rule()==unsigned(masks[i])",0x1e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (((string *)CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_)
                != &local_128) ||
              (local_1e8.begin_._M_current !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      (local_128._M_dataplus._M_p + 8))->_M_pi - *(long *)local_128._M_dataplus._M_p
               >> 4)));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length);
    }
    local_128._M_string_length = 0;
    local_128.field_2._M_allocated_capacity = 0;
    local_128.field_2._8_8_ = 0;
    local_108 = 0xffffffff;
    local_104 = 0;
    local_128._M_dataplus._M_p = (pointer)local_188;
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_count<(__gnu_cxx::_Lock_policy)2> *)&local_128._M_string_length,&_Stack_180
              );
    local_128.field_2._M_allocated_capacity = local_178._M_allocated_capacity;
    local_128.field_2._8_8_ = local_178._8_8_;
    local_108 = local_168;
    local_104 = local_164;
    local_1f8._0_8_ = (pointer)0x0;
    local_1f8._8_8_ = (wchar_t *)0x0;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_1e8.begin_._M_current = (wchar_t *)0x0;
    local_1e8.end_._M_current._0_5_ = 0;
    local_1e8.end_._M_current._5_3_ = 0;
    local_228.end_._M_current._0_5_ = SUB85(&local_128,0);
    local_228.end_._M_current._5_3_ = (undefined3)((ulong)&local_128 >> 0x28);
    local_208 = local_168;
    local_204 = (bool)local_164;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
    local_228.begin_._M_current = (wchar_t *)0x0;
    local_238._0_8_ = local_178._M_allocated_capacity;
    local_238._8_8_ = local_178._M_allocated_capacity;
    local_228.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr = (element_type *)
              ((ulong)local_228.index_.
                      super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
                      ._M_ptr & 0xffffffff00000000);
    booster::locale::boundary::details::
    segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                 *)local_238);
    local_1f8._0_8_ = local_238._0_8_;
    local_1f8._8_8_ = local_238._8_8_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_ptr._0_4_ =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_ptr._0_4_;
    local_1e8.index_.
    super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
    ._M_refcount._M_pi =
         local_228.index_.
         super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
         ._M_refcount._M_pi;
    local_1e8.begin_._M_current = local_228.begin_._M_current;
    local_1c8 = local_208;
    local_1c4 = local_204;
    local_1e8.end_._M_current._0_5_ = local_228.end_._M_current._0_5_;
    local_1e8.end_._M_current._5_3_ = local_228.end_._M_current._5_3_;
    if (((string *)CONCAT35(local_228.end_._M_current._5_3_,local_228.end_._M_current._0_5_) !=
         &local_128) ||
       (local_228.begin_._M_current !=
        (wchar_t *)
        ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)(local_128._M_dataplus._M_p + 8))->
               _M_pi - *(long *)local_128._M_dataplus._M_p >> 4))) {
      uVar11 = 0;
      do {
        test_counter = test_counter + 1;
        local_238._0_8_ = &local_228;
        std::__cxx11::wstring::
        _M_construct<__gnu_cxx::__normal_iterator<wchar_t*,std::__cxx11::wstring>>
                  ((wstring *)local_238,local_1f8._0_8_,local_1f8._8_8_);
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._8_8_ ==
            (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_148.
               super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_string_length) {
          if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)local_238._8_8_ ==
              (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
               *)0x0) {
            bVar14 = true;
          }
          else {
            iVar5 = wmemcmp((wchar_t *)local_238._0_8_,
                            local_148.
                            super__Vector_base<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                            ._M_impl.super__Vector_impl_data._M_start[uVar11]._M_dataplus._M_p,
                            local_238._8_8_);
            bVar14 = iVar5 == 0;
          }
        }
        else {
          bVar14 = false;
        }
        if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
             *)local_238._0_8_ != &local_228) {
          operator_delete((void *)local_238._0_8_);
        }
        if (!bVar14) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x147);
          std::__ostream_insert<char,std::char_traits<char>>(poVar7," p->str()==chunks[i]",0x14);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        test_counter = test_counter + 1;
        if (local_1e8.index_.
            super___shared_ptr<std::vector<booster::locale::boundary::break_info,_std::allocator<booster::locale::boundary::break_info>_>,_(__gnu_cxx::_Lock_policy)2>
            ._M_ptr._0_4_ != *(wchar_t *)((long)local_d8 + uVar11 * 4)) {
          std::__ostream_insert<char,std::char_traits<char>>
                    ((ostream *)&std::cerr,"Error in line:",0xe);
          poVar7 = (ostream *)std::ostream::operator<<((ostream *)&std::cerr,0x148);
          std::__ostream_insert<char,std::char_traits<char>>
                    (poVar7," p->rule()==unsigned(masks[i])",0x1e);
          std::ios::widen((char)*(undefined8 *)(*(long *)poVar7 + -0x18) + (char)poVar7);
          std::ostream::put((char)poVar7);
          std::ostream::flush();
          iVar5 = error_counter + 1;
          bVar14 = 100000 < error_counter;
          error_counter = iVar5;
          if (bVar14) {
            prVar9 = (runtime_error *)__cxa_allocate_exception(0x30);
            local_238._0_8_ = &local_228;
            std::__cxx11::string::_M_construct<char_const*>
                      ((string *)local_238,"Error limits reached, stopping unit test","");
            booster::runtime_error::runtime_error(prVar9,(string *)local_238);
            __cxa_throw(prVar9,&booster::runtime_error::typeinfo,
                        booster::runtime_error::~runtime_error);
          }
        }
        booster::locale::boundary::details::
        segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
        ::increment((segment_index_iterator<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
                     *)local_1f8);
        uVar11 = (ulong)((int)uVar11 + 1);
      } while (((string *)CONCAT35(local_1e8.end_._M_current._5_3_,local_1e8.end_._M_current._0_5_)
                != &local_128) ||
              (local_1e8.begin_._M_current !=
               (wchar_t *)
               ((long)((__shared_count<(__gnu_cxx::_Lock_policy)2> *)
                      (local_128._M_dataplus._M_p + 8))->_M_pi - *(long *)local_128._M_dataplus._M_p
               >> 4)));
    }
    if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length !=
        (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_128._M_string_length);
    }
    uVar8 = local_38;
    if (_Stack_180._M_pi != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_180._M_pi);
    }
    if ((mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)_Stack_1b0._M_pi !=
        (mapping<__gnu_cxx::__normal_iterator<wchar_t_*,_std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
         *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(_Stack_1b0._M_pi);
    }
    if (local_f8 != (void *)0x0) {
      operator_delete(local_f8);
    }
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::~vector(&local_78);
    std::
    vector<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>,_std::allocator<std::__cxx11::basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_>_>
    ::~vector(&local_148);
    if ((anon_union_16_2_edb7204a_for_basic_string<wchar_t,_std::char_traits<wchar_t>,_std::allocator<wchar_t>_>_11
         *)local_58._M_dataplus._M_p != &local_58.field_2) {
      operator_delete(local_58._M_dataplus._M_p);
    }
    if (local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
        super__Vector_impl_data._M_start != (pointer)0x0) {
      operator_delete(local_b8.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                      _M_impl.super__Vector_impl_data._M_start);
    }
    if (local_98 != (void *)0x0) {
      operator_delete(local_98);
    }
    if (local_d8 != (void *)0x0) {
      operator_delete(local_d8);
    }
    uVar11 = (ulong)((int)uVar8 - 1);
    if ((int)uVar8 < 1) {
      return;
    }
  } while( true );
}

Assistant:

void test_word_container(Iterator begin,Iterator end,
    std::vector<int> const &ipos,
    std::vector<int> const &imasks,
    std::vector<std::basic_string<Char> > const &ichunks,
    std::locale l,
    lb::boundary_type bt=lb::word
    )
{
    for(int sm=(bt == lb::word ? 31 : 3 ) ;sm>=0;sm--) {
        unsigned mask = 
              ((sm & 1 ) != 0) * 0xF
            + ((sm & 2 ) != 0) * 0xF0
            + ((sm & 4 ) != 0) * 0xF00
            + ((sm & 8 ) != 0) * 0xF000
            + ((sm & 16) != 0) * 0xF0000;

        std::vector<int> masks,pos;
        std::vector<unsigned> bmasks;
        std::basic_string<Char> empty_chunk;

        std::vector<std::basic_string<Char> > chunks;
        std::vector<std::basic_string<Char> > fchunks;
        std::vector<Iterator> iters;
        iters.push_back(begin);
        bmasks.push_back(0);

        for(unsigned i=0;i<imasks.size();i++) {
            if(imasks[i] & mask) {
                masks.push_back(imasks[i]);
                chunks.push_back(ichunks[i]);
                fchunks.push_back(empty_chunk + ichunks[i]);
                empty_chunk.clear();
                pos.push_back(ipos[i]);
            }
            else {
                empty_chunk+=ichunks[i];
            }

            if((imasks[i] & mask) || i==imasks.size()-1){
                Iterator ptr=begin;
                std::advance(ptr,ipos[i]);
                iters.push_back(ptr);
                bmasks.push_back(imasks[i]);
            }
        }

        //
        // segment iterator tests
        //
        {
            lb::segment_index<Iterator> map(bt,begin,end,l);
            typedef typename lb::segment_index<Iterator>::iterator iter_type;

            map.rule(mask);

            {        
                unsigned i=0;
                iter_type p;
                map.full_select(false);
                for(p=map.begin();p!=map.end();++p,i++) {
                    TEST(p->str()==chunks[i]);
                    TEST(p->rule() == unsigned(masks[i]));
                }
                
                TEST(chunks.size() == i);
                for(;;) {
                    if(p==map.begin()) {
                        TEST(i==0);
                        break;
                    }
                    else {
                        --p;
                        TEST(p->str()==chunks[--i]);
                        TEST(p->rule() == unsigned(masks[i]));
                    }
                }
                for(i=0,p=map.end();i<chunks.size();i++){
                    --p;
                    unsigned index = chunks.size() - i - 1;
                    TEST(p->str()==chunks[index]);
                    TEST(p->rule() == unsigned(masks[index]));
                }
                TEST(p==map.begin());
            }

            {
                unsigned i=0;
                iter_type p;
                map.full_select(true);
                for(p=map.begin();p!=map.end();++p,i++) {
                    TEST(p->str()==fchunks[i]);
                    TEST(p->rule() == unsigned(masks[i]));
                }

                TEST(chunks.size() == i);
                
                for(;;) {
                    if(p==map.begin()) {
                        TEST(i==0);
                        break;
                    }
                    else {
                        --p;
                        if(p->str()!=fchunks[i-1]) {
                            print_str(p->str());
                            print_str(fchunks[i-1]);
                        }
                        TEST(p->str()==fchunks[--i]);
                        TEST(p->rule() == unsigned(masks[i]));
                    }
                }
                
                for(i=0,p=map.end();i<chunks.size();i++){
                    --p;
                    unsigned index = chunks.size() - i - 1;
                    TEST(p->str()==fchunks[index]);
                    TEST(p->rule() == unsigned(masks[index]));
                }
                TEST(p==map.begin());
            }
            
            {            
                iter_type p;
                unsigned chunk_ptr=0;
                unsigned i=0;
                map.full_select(false);
                for(Iterator optr=begin;optr!=end;optr++,i++) {
                    p=map.find(optr);
                    if(chunk_ptr < pos.size() && i>=unsigned(pos[chunk_ptr])){
                        chunk_ptr++;
                    }
                    if(chunk_ptr>=pos.size()) {
                        TEST(p==map.end());
                    }
                    else {
                        TEST(p->str()==chunks[chunk_ptr]);
                        TEST(p->rule()==unsigned(masks[chunk_ptr]));
                    }
                }
            }
            {            
                iter_type p;
                unsigned chunk_ptr=0;
                unsigned i=0;
                map.full_select(true);
                for(Iterator optr=begin;optr!=end;optr++,i++) {
                    p=map.find(optr);
                    if(chunk_ptr < pos.size() && i>=unsigned(pos[chunk_ptr])){
                        chunk_ptr++;
                    }
                    if(chunk_ptr>=pos.size()) {
                        TEST(p==map.end());
                    }
                    else {
                        TEST(p->str()==fchunks[chunk_ptr]);
                        TEST(p->rule()==unsigned(masks[chunk_ptr]));
                    }
                }
            }

        } // segment iterator tests

        { // break iterator tests
            lb::boundary_point_index<Iterator> map(bt,begin,end,l);
            typedef typename lb::boundary_point_index<Iterator>::iterator iter_type;

            map.rule(mask);
        
            unsigned i=0;
            iter_type p;
            for(p=map.begin();p!=map.end();++p,i++) {
                TEST(p->iterator()==iters[i]);
                TEST(p->rule()==bmasks[i]);
            }

            TEST(iters.size() == i);

            do {
                --p;
                --i;
                TEST(p->iterator()==iters.at(i));
            } while(p!=map.begin());
            TEST(i==0);

            unsigned iters_ptr=0;
            for(Iterator optr=begin;optr!=end;optr++) {
                p=map.find(optr);
                TEST(p->iterator()==iters[iters_ptr]);
                if(iters.at(iters_ptr)==optr)
                    iters_ptr++;
            }
        
        } // break iterator tests

        { // copy test
            typedef lb::segment_index<Iterator> ti_type;
            typedef lb::boundary_point_index<Iterator> bi_type;
            {   // segment to bound
                ti_type ti(bt,begin,end,l);
                ti.rule(mask);
                {
                    bi_type bi(ti);
                    bi.rule(mask);
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
                {
                    bi_type bi;
                    bi.rule(mask);
                    bi = ti;
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
                // boundary_point to bound
                bi_type bi_2(bt,begin,end,l);
                bi_2.rule(mask);
                {
                    bi_type bi(bi_2);
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
                {
                    bi_type bi;
                    bi = bi_2;
                    unsigned i=0;
                    typename bi_type::iterator p;
                    for(p=bi.begin();p!=bi.end();++p,i++) {
                        TEST(p->iterator()==iters[i]);
                        TEST(p->rule()==bmasks[i]);
                    }
                }
            }
            {   // boundary_point to segment
                bi_type bi(bt,begin,end,l);
                {
                    ti_type ti(bi);
                    ti.rule(mask);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
                {
                    ti_type ti;
                    ti.rule(mask);
                    ti = (bi);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
                ti_type ti_2(bt,begin,end,l);
                ti_2.rule(mask);
                {
                    ti_type ti(ti_2);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
                {
                    ti_type ti;
                    ti = (ti_2);
                    unsigned i=0;
                    typename ti_type::iterator p;
                    for(p=ti.begin();p!=ti.end();++p,i++) {
                        TEST(p->str()==chunks[i]);
                        TEST(p->rule()==unsigned(masks[i]));
                    }
                }
            }
        }
    } // for mask

}